

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledInputFile::Data::~Data(Data *this)

{
  value_type pTVar1;
  size_type sVar2;
  reference ppTVar3;
  Header *pHVar4;
  reference ppTVar5;
  long in_RDI;
  size_t i_1;
  size_t i;
  TileBuffer *in_stack_ffffffffffffffa0;
  Array<char> *this_00;
  Header *this_01;
  Header *local_18;
  ulong local_10;
  
  if (*(void **)(in_RDI + 0x100) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x100));
  }
  if (*(void **)(in_RDI + 0x108) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x108));
  }
  for (local_10 = 0;
      sVar2 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                      *)(in_RDI + 0x170)), local_10 < sVar2; local_10 = local_10 + 1) {
    ppTVar3 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x170),local_10);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (value_type)0x0) {
      anon_unknown_8::TileBuffer::~TileBuffer(in_stack_ffffffffffffffa0);
      operator_delete(pTVar1,0xa0);
    }
  }
  if (((*(byte *)(in_RDI + 0x15c) & 1) != 0) && (*(long **)(in_RDI + 0x168) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x168) + 8))();
  }
  local_18 = (Header *)0x0;
  while (this_01 = local_18,
        pHVar4 = (Header *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                         *)(in_RDI + 0x140)), this_01 < pHVar4) {
    ppTVar5 = std::
              vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                            *)(in_RDI + 0x140),(size_type)local_18);
    if (*ppTVar5 != (value_type)0x0) {
      operator_delete(*ppTVar5,0x40);
    }
    local_18 = (Header *)&(local_18->_map)._M_t._M_impl.field_0x1;
  }
  this_00 = *(Array<char> **)(in_RDI + 0x1c0);
  if (this_00 != (Array<char> *)0x0) {
    (**(code **)(this_00->_size + 8))();
  }
  Array<char>::~Array(this_00);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             *)this_01);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
             *)this_01);
  TileOffsets::~TileOffsets((TileOffsets *)0x8ec0ae);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x8ec0bc);
  Header::~Header(this_01);
  return;
}

Assistant:

DeepTiledInputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        delete tileBuffers[i];

    if (multiPartBackwardSupport)
        delete multiPartFile;

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];

    delete sampleCountTableComp;
}